

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void __thiscall
discordpp::
field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
::field(field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
        *this,field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
              *f)

{
  _Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
  __x;
  _Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
  this_00;
  
  __x._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
       .
       super__Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
       ._M_head_impl;
  if (&(__x._M_head_impl)->_M_t ==
      (_Rb_tree<discordpp::Snowflake,_std::pair<const_discordpp::Snowflake,_discordpp::User>,_std::_Select1st<std::pair<const_discordpp::Snowflake,_discordpp::User>_>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
       *)0x0) {
    this_00._M_head_impl =
         (map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
          *)0x0;
  }
  else {
    this_00._M_head_impl =
         (map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
          *)operator_new(0x30);
    std::
    _Rb_tree<discordpp::Snowflake,_std::pair<const_discordpp::Snowflake,_discordpp::User>,_std::_Select1st<std::pair<const_discordpp::Snowflake,_discordpp::User>_>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
    ::_Rb_tree((_Rb_tree<discordpp::Snowflake,_std::pair<const_discordpp::Snowflake,_discordpp::User>,_std::_Select1st<std::pair<const_discordpp::Snowflake,_discordpp::User>_>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>
                *)this_00._M_head_impl,&(__x._M_head_impl)->_M_t);
  }
  (this->t_)._M_t.
  super___uniq_ptr_impl<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
  .
  super__Head_base<0UL,_std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_*,_false>
  ._M_head_impl = this_00._M_head_impl;
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}